

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall
ObjectModelBuilder::buildProperty(ObjectModelBuilder *this,string *propertyString,Class *clazz)

{
  long lVar1;
  ostream *poVar2;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  string prop;
  
  string_trim((string *)local_50,propertyString);
  lVar1 = std::__cxx11::string::find_last_of((char *)local_50,0x11ce84,0xffffffffffffffff);
  if (lVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: invalid property: ",0x19);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,(long)prop._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," in class: ",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_98 = (undefined1  [8])clazz;
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_50);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_50);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    std::vector<Property,_std::allocator<Property>_>::push_back
              (&clazz->properties,(value_type *)local_98);
    if (this->m_verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - property: type=\'",0x13);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_70._M_p,local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\', name=\'",9);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_90._M_p,local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p);
    }
  }
  if (local_50 != (undefined1  [8])&prop._M_string_length) {
    operator_delete((void *)local_50);
  }
  return lVar1 != -1;
}

Assistant:

bool ObjectModelBuilder::buildProperty(const std::string &propertyString, Class *clazz)
{
    std::string prop = string_trim(propertyString);
    size_t space = prop.find_last_of(" ");
    if (space == std::string::npos) {
        std::cerr << "error: invalid property: " << prop << " in class: " << clazz->name << std::endl;
        return false;
    }
    Property property;
    property.clazz = clazz;
    property.type = prop.substr(0, space);
    property.name = prop.substr(space+1);

    clazz->properties.push_back(property);

    if (m_verbose)
        std::cerr << " - property: type='" << property.type << "', name='" << property.name << "'" << std::endl;

    return true;
}